

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udataswp.cpp
# Opt level: O1

UDataSwapper *
udata_openSwapper_63
          (UBool inIsBigEndian,uint8_t inCharset,UBool outIsBigEndian,uint8_t outCharset,
          UErrorCode *pErrorCode)

{
  UDataSwapper *pUVar1;
  code *pcVar2;
  code *pcVar3;
  code *pcVar4;
  bool bVar5;
  
  if (pErrorCode == (UErrorCode *)0x0) {
    return (UDataSwapper *)0x0;
  }
  if (*pErrorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    if ((outCharset | inCharset) < 2) {
      pUVar1 = (UDataSwapper *)uprv_malloc_63(0x60);
      if (pUVar1 != (UDataSwapper *)0x0) {
        pUVar1->inIsBigEndian = '\0';
        pUVar1->inCharset = '\0';
        pUVar1->outIsBigEndian = '\0';
        pUVar1->outCharset = '\0';
        *(undefined4 *)&pUVar1->field_0x4 = 0;
        pUVar1->readUInt16 = (UDataReadUInt16 *)0x0;
        pUVar1->readUInt32 = (UDataReadUInt32 *)0x0;
        pUVar1->compareInvChars = (UDataCompareInvChars *)0x0;
        pUVar1->writeUInt16 = (UDataWriteUInt16 *)0x0;
        pUVar1->writeUInt32 = (UDataWriteUInt32 *)0x0;
        pUVar1->swapArray16 = (UDataSwapFn *)0x0;
        pUVar1->swapArray32 = (UDataSwapFn *)0x0;
        pUVar1->swapArray64 = (UDataSwapFn *)0x0;
        pUVar1->swapInvChars = (UDataSwapFn *)0x0;
        pUVar1->printError = (UDataPrintError *)0x0;
        pUVar1->printErrorContext = (void *)0x0;
        pUVar1->inIsBigEndian = inIsBigEndian;
        pUVar1->inCharset = inCharset;
        pUVar1->outIsBigEndian = outIsBigEndian;
        pUVar1->outCharset = outCharset;
        pcVar2 = uprv_readSwapUInt16;
        if (inIsBigEndian == '\0') {
          pcVar2 = uprv_readDirectUInt16;
        }
        pUVar1->readUInt16 = pcVar2;
        pcVar2 = uprv_readSwapUInt32;
        if (inIsBigEndian == '\0') {
          pcVar2 = uprv_readDirectUInt32;
        }
        pcVar3 = uprv_writeSwapUInt16;
        if (outIsBigEndian == '\0') {
          pcVar3 = uprv_writeDirectUInt16;
        }
        pUVar1->readUInt32 = pcVar2;
        pUVar1->writeUInt16 = pcVar3;
        pcVar2 = uprv_writeSwapUInt32;
        if (outIsBigEndian == '\0') {
          pcVar2 = uprv_writeDirectUInt32;
        }
        pUVar1->writeUInt32 = pcVar2;
        if (outCharset == '\0') {
          pcVar2 = uprv_compareInvAscii_63;
        }
        else {
          pcVar2 = uprv_compareInvEbcdic_63;
        }
        pUVar1->compareInvChars = pcVar2;
        bVar5 = inIsBigEndian == outIsBigEndian;
        pcVar2 = uprv_swapArray16;
        if (bVar5) {
          pcVar2 = uprv_copyArray16;
        }
        pcVar3 = uprv_swapArray32;
        if (bVar5) {
          pcVar3 = uprv_copyArray32;
        }
        pcVar4 = uprv_swapArray64;
        if (bVar5) {
          pcVar4 = uprv_copyArray64;
        }
        pUVar1->swapArray16 = pcVar2;
        pUVar1->swapArray32 = pcVar3;
        pUVar1->swapArray64 = pcVar4;
        if (inCharset == '\0') {
          if (outCharset == '\0') {
            pcVar2 = uprv_copyAscii_63;
          }
          else {
            pcVar2 = uprv_ebcdicFromAscii_63;
          }
        }
        else if (outCharset == '\x01') {
          pcVar2 = uprv_copyEbcdic_63;
        }
        else {
          pcVar2 = uprv_asciiFromEbcdic_63;
        }
        pUVar1->swapInvChars = pcVar2;
        return pUVar1;
      }
      *pErrorCode = U_MEMORY_ALLOCATION_ERROR;
    }
    else {
      *pErrorCode = U_ILLEGAL_ARGUMENT_ERROR;
    }
  }
  return (UDataSwapper *)0x0;
}

Assistant:

U_CAPI UDataSwapper * U_EXPORT2
udata_openSwapper(UBool inIsBigEndian, uint8_t inCharset,
                  UBool outIsBigEndian, uint8_t outCharset,
                  UErrorCode *pErrorCode) {
    UDataSwapper *swapper;

    if(pErrorCode==NULL || U_FAILURE(*pErrorCode)) {
        return NULL;
    }
    if(inCharset>U_EBCDIC_FAMILY || outCharset>U_EBCDIC_FAMILY) {
        *pErrorCode=U_ILLEGAL_ARGUMENT_ERROR;
        return NULL;
    }

    /* allocate the swapper */
    swapper=(UDataSwapper *)uprv_malloc(sizeof(UDataSwapper));
    if(swapper==NULL) {
        *pErrorCode=U_MEMORY_ALLOCATION_ERROR;
        return NULL;
    }
    uprv_memset(swapper, 0, sizeof(UDataSwapper));

    /* set values and functions pointers according to in/out parameters */
    swapper->inIsBigEndian=inIsBigEndian;
    swapper->inCharset=inCharset;
    swapper->outIsBigEndian=outIsBigEndian;
    swapper->outCharset=outCharset;

    swapper->readUInt16= inIsBigEndian==U_IS_BIG_ENDIAN ? uprv_readDirectUInt16 : uprv_readSwapUInt16;
    swapper->readUInt32= inIsBigEndian==U_IS_BIG_ENDIAN ? uprv_readDirectUInt32 : uprv_readSwapUInt32;

    swapper->writeUInt16= outIsBigEndian==U_IS_BIG_ENDIAN ? uprv_writeDirectUInt16 : uprv_writeSwapUInt16;
    swapper->writeUInt32= outIsBigEndian==U_IS_BIG_ENDIAN ? uprv_writeDirectUInt32 : uprv_writeSwapUInt32;

    swapper->compareInvChars= outCharset==U_ASCII_FAMILY ? uprv_compareInvAscii : uprv_compareInvEbcdic;

    if(inIsBigEndian==outIsBigEndian) {
        swapper->swapArray16=uprv_copyArray16;
        swapper->swapArray32=uprv_copyArray32;
        swapper->swapArray64=uprv_copyArray64;
    } else {
        swapper->swapArray16=uprv_swapArray16;
        swapper->swapArray32=uprv_swapArray32;
        swapper->swapArray64=uprv_swapArray64;
    }

    if(inCharset==U_ASCII_FAMILY) {
        swapper->swapInvChars= outCharset==U_ASCII_FAMILY ? uprv_copyAscii : uprv_ebcdicFromAscii;
    } else /* U_EBCDIC_FAMILY */ {
        swapper->swapInvChars= outCharset==U_EBCDIC_FAMILY ? uprv_copyEbcdic : uprv_asciiFromEbcdic;
    }

    return swapper;
}